

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

bool __thiscall tsip::open_gps_port(tsip *this,string *port)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  tsip *in_RSI;
  undefined1 *in_RDI;
  char *in_stack_ffffffffffffff98;
  string *port_00;
  tsip *this_00;
  string local_38 [16];
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  bool local_1;
  
  this_00 = in_RSI;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RSI,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)in_RSI,(string *)(in_RDI + 0x9c8));
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_00,in_stack_ffffffffffffff98);
  if (bVar1) {
    printf("Port must be provided in call or in set_gps_port\n");
    local_1 = false;
  }
  else {
    port_00 = (string *)local_38;
    std::__cxx11::string::string((string *)port_00,(string *)in_RSI);
    set_gps_port(this_00,port_00);
    std::__cxx11::string::~string(local_38);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen(pcVar2,"r");
    *(FILE **)(in_RDI + 0x9e8) = pFVar3;
    if (*(long *)(in_RDI + 0x9e8) == 0) {
      uVar4 = std::__cxx11::string::c_str();
      printf("Cannot open %s\n",uVar4);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      perror(pcVar2);
      *in_RDI = 0;
      local_1 = false;
    }
    else {
      setup_gps_port((tsip *)in_stack_ffffffffffffffe0,(FILE *)in_stack_ffffffffffffffd8);
      *in_RDI = 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool tsip::open_gps_port(std::string port)
{
	if (port == "") {
		port = gps_port;
	}
	if (port == "") {
		printf("Port must be provided in call or in set_gps_port\n");
		return(false);
	}

	// set the port
	set_gps_port(port);

    file = fopen(gps_port.c_str(), "r");

	if (file != NULL) {
		setup_gps_port(file);
		port_status = true;
		return(true);
	} else {
		printf("Cannot open %s\n", gps_port.c_str());
		perror(gps_port.c_str());
		port_status = false;
        return (false);
	}
    //if(!file) {
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //return (false);
    //}
	//printf("calling setup\n");
    //setup_gps_port(file);
    //printf("return from setup\n");
    //return(true);
}